

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O2

sha1_hash * libtorrent::aux::hash_address(sha1_hash *__return_storage_ptr__,address *ip)

{
  anon_union_16_3_a3f0114d_for___in6_u local_48 [2];
  char local_28 [16];
  
  if (ip->type_ == ipv6) {
    boost::asio::ip::address::to_v6((address_v6 *)local_48,ip);
    local_28[0] = local_48[0]._0_1_;
    local_28[1] = local_48[0]._1_1_;
    local_28[2] = local_48[0]._2_1_;
    local_28[3] = local_48[0]._3_1_;
    local_28[4] = local_48[0]._4_1_;
    local_28[5] = local_48[0]._5_1_;
    local_28[6] = local_48[0]._6_1_;
    local_28[7] = local_48[0]._7_1_;
    local_28[8] = local_48[0]._8_1_;
    local_28[9] = local_48[0]._9_1_;
    local_28[10] = local_48[0]._10_1_;
    local_28[0xb] = local_48[0]._11_1_;
    local_28[0xc] = local_48[0]._12_1_;
    local_28[0xd] = local_48[0]._13_1_;
    local_28[0xe] = local_48[0]._14_1_;
    local_28[0xf] = local_48[0]._15_1_;
    lcrypto::hasher::hasher((hasher *)local_48,local_28,0x10);
    lcrypto::hasher::final(__return_storage_ptr__,(hasher *)local_48);
  }
  else {
    boost::asio::ip::address::to_v4((address *)local_28);
    lcrypto::hasher::hasher((hasher *)local_48,local_28,4);
    lcrypto::hasher::final(__return_storage_ptr__,(hasher *)local_48);
  }
  lcrypto::hasher::~hasher((hasher *)local_48);
  return __return_storage_ptr__;
}

Assistant:

sha1_hash hash_address(address const& ip)
	{
		if (ip.is_v6())
		{
			address_v6::bytes_type b = ip.to_v6().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
		else
		{
			address_v4::bytes_type b = ip.to_v4().to_bytes();
			return hasher(reinterpret_cast<char const*>(b.data()), int(b.size())).final();
		}
	}